

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3BtreeClose(Btree *p)

{
  int *piVar1;
  int iVar2;
  BtShared *p_00;
  Btree *pBVar3;
  BtShared *pBVar4;
  int extraout_EAX;
  sqlite3_mutex *psVar5;
  BtShared **ppBVar6;
  BtShared *pBVar7;
  u8 *p_01;
  
  p_00 = p->pBt;
  if ((p->sharable != '\0') && (p->wantToLock = p->wantToLock + 1, p->locked == '\0')) {
    btreeLockCarefully(p);
  }
  sqlite3BtreeRollback(p,0,0);
  if (p->sharable != '\0') {
    piVar1 = &p->wantToLock;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      unlockBtreeMutex(p);
    }
  }
  if (p->sharable != '\0') {
    if (sqlite3Config.bCoreMutex == '\0') {
      psVar5 = (sqlite3_mutex *)0x0;
    }
    else {
      psVar5 = (*sqlite3Config.mutex.xMutexAlloc)(2);
    }
    if (psVar5 != (sqlite3_mutex *)0x0) {
      (*sqlite3Config.mutex.xMutexEnter)(psVar5);
    }
    iVar2 = p_00->nRef;
    p_00->nRef = iVar2 + -1;
    if (iVar2 < 2) {
      pBVar4 = sqlite3SharedCacheList;
      if (sqlite3SharedCacheList == p_00) {
        ppBVar6 = &sqlite3SharedCacheList;
      }
      else {
        do {
          pBVar7 = pBVar4;
          if (pBVar7 == (BtShared *)0x0) goto LAB_001408f6;
          pBVar4 = pBVar7->pNext;
        } while (pBVar7->pNext != p_00);
        ppBVar6 = &pBVar7->pNext;
      }
      *ppBVar6 = p_00->pNext;
LAB_001408f6:
      if (p_00->mutex != (sqlite3_mutex *)0x0) {
        (*sqlite3Config.mutex.xMutexFree)(p_00->mutex);
      }
    }
    if (psVar5 != (sqlite3_mutex *)0x0) {
      (*sqlite3Config.mutex.xMutexLeave)(psVar5);
    }
    if (1 < iVar2) goto LAB_00140975;
  }
  sqlite3PagerClose(p_00->pPager,p->db);
  if ((p_00->xFreeSchema != (_func_void_void_ptr *)0x0) && (p_00->pSchema != (void *)0x0)) {
    (*p_00->xFreeSchema)(p_00->pSchema);
  }
  if (p_00->pSchema != (void *)0x0) {
    sqlite3_free(p_00->pSchema);
  }
  if (p_00->pTmpSpace != (u8 *)0x0) {
    p_01 = p_00->pTmpSpace + -4;
    p_00->pTmpSpace = p_01;
    pcache1Free(p_01);
    p_00->pTmpSpace = (u8 *)0x0;
  }
  sqlite3_free(p_00);
LAB_00140975:
  pBVar3 = p->pPrev;
  if (pBVar3 != (Btree *)0x0) {
    pBVar3->pNext = p->pNext;
  }
  if (p->pNext != (Btree *)0x0) {
    p->pNext->pPrev = pBVar3;
  }
  sqlite3_free(p);
  return extraout_EAX;
}

Assistant:

SQLITE_PRIVATE int sqlite3BtreeClose(Btree *p){
  BtShared *pBt = p->pBt;

  /* Close all cursors opened via this handle.  */
  assert( sqlite3_mutex_held(p->db->mutex) );
  sqlite3BtreeEnter(p);

  /* Verify that no other cursors have this Btree open */
#ifdef SQLITE_DEBUG
  {
    BtCursor *pCur = pBt->pCursor;
    while( pCur ){
      BtCursor *pTmp = pCur;
      pCur = pCur->pNext;
      assert( pTmp->pBtree!=p );

    }
  }
#endif

  /* Rollback any active transaction and free the handle structure.
  ** The call to sqlite3BtreeRollback() drops any table-locks held by
  ** this handle.
  */
  sqlite3BtreeRollback(p, SQLITE_OK, 0);
  sqlite3BtreeLeave(p);

  /* If there are still other outstanding references to the shared-btree
  ** structure, return now. The remainder of this procedure cleans
  ** up the shared-btree.
  */
  assert( p->wantToLock==0 && p->locked==0 );
  if( !p->sharable || removeFromSharingList(pBt) ){
    /* The pBt is no longer on the sharing list, so we can access
    ** it without having to hold the mutex.
    **
    ** Clean out and delete the BtShared object.
    */
    assert( !pBt->pCursor );
    sqlite3PagerClose(pBt->pPager, p->db);
    if( pBt->xFreeSchema && pBt->pSchema ){
      pBt->xFreeSchema(pBt->pSchema);
    }
    sqlite3DbFree(0, pBt->pSchema);
    freeTempSpace(pBt);
    sqlite3_free(pBt);
  }

#ifndef SQLITE_OMIT_SHARED_CACHE
  assert( p->wantToLock==0 );
  assert( p->locked==0 );
  if( p->pPrev ) p->pPrev->pNext = p->pNext;
  if( p->pNext ) p->pNext->pPrev = p->pPrev;
#endif

  sqlite3_free(p);
  return SQLITE_OK;
}